

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperUtils.c
# Opt level: O0

int Map_CompareNodesByLevel(Map_Node_t **ppS1,Map_Node_t **ppS2)

{
  Map_Node_t *pN2;
  Map_Node_t *pN1;
  Map_Node_t **ppS2_local;
  Map_Node_t **ppS1_local;
  
  if ((*(uint *)(((ulong)*ppS2 & 0xfffffffffffffffe) + 0x1c) >> 5 & 0xffff) <
      (*(uint *)(((ulong)*ppS1 & 0xfffffffffffffffe) + 0x1c) >> 5 & 0xffff)) {
    ppS1_local._4_4_ = -1;
  }
  else if ((*(uint *)(((ulong)*ppS1 & 0xfffffffffffffffe) + 0x1c) >> 5 & 0xffff) <
           (*(uint *)(((ulong)*ppS2 & 0xfffffffffffffffe) + 0x1c) >> 5 & 0xffff)) {
    ppS1_local._4_4_ = 1;
  }
  else {
    ppS1_local._4_4_ = 0;
  }
  return ppS1_local._4_4_;
}

Assistant:

int Map_CompareNodesByLevel( Map_Node_t ** ppS1, Map_Node_t ** ppS2 )
{
    Map_Node_t * pN1 = Map_Regular(*ppS1);
    Map_Node_t * pN2 = Map_Regular(*ppS2);
    if ( pN1->Level > pN2->Level )
        return -1;
    if ( pN1->Level < pN2->Level )
        return 1;
    return 0;
}